

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# detection.cpp
# Opt level: O3

vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
* pobr::imgProcessing::utils::detection::groupLetters
            (vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
             *__return_storage_ptr__,
            vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
            *segments)

{
  value_type *pvVar1;
  Segment *pSVar2;
  pair<double,_double> pVar3;
  pointer pSVar4;
  pointer pSVar5;
  bool bVar6;
  int iVar7;
  undefined4 extraout_EAX;
  uint uVar8;
  undefined4 extraout_EAX_00;
  uint64_t uVar9;
  uint64_t uVar10;
  long lVar11;
  uint uVar12;
  undefined *puVar13;
  Segment *pSVar14;
  value_type *this;
  pointer pSVar15;
  pointer this_00;
  vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
  *this_01;
  Segment *this_02;
  double dVar16;
  double dVar17;
  undefined1 auVar18 [16];
  double dVar23;
  double dVar24;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  double dVar25;
  double dVar26;
  double in_XMM1_Qb;
  double dVar27;
  double dVar28;
  pair<double,_double> pVar29;
  vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
  lettersO;
  vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
  lettersC;
  vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
  lettersS;
  vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
  lettersE;
  vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
  lettersT;
  string classification;
  Segment segmentC;
  Segment segmentS;
  Segment bbox;
  double local_3a8;
  double local_378;
  vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
  local_348;
  vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
  local_328;
  vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
  local_308;
  vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
  local_2e8;
  vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
  local_2c8;
  double local_2a8;
  undefined8 uStack_2a0;
  double local_298;
  double dStack_290;
  double local_288;
  Segment *local_270;
  double local_268;
  double dStack_260;
  double local_258;
  double dStack_250;
  double local_248;
  undefined8 uStack_240;
  undefined1 local_238 [32];
  uint local_218 [24];
  Segment local_1b8;
  Segment local_138;
  value_type local_b8;
  
  (__return_storage_ptr__->
  super__Vector_base<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2c8.
  super__Vector_base<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2c8.
  super__Vector_base<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
  ._M_impl.super__Vector_impl_data._M_start = (Segment *)0x0;
  local_2c8.
  super__Vector_base<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
  ._M_impl.super__Vector_impl_data._M_finish = (Segment *)0x0;
  local_2e8.
  super__Vector_base<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2e8.
  super__Vector_base<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
  ._M_impl.super__Vector_impl_data._M_start = (Segment *)0x0;
  local_2e8.
  super__Vector_base<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
  ._M_impl.super__Vector_impl_data._M_finish = (Segment *)0x0;
  local_308.
  super__Vector_base<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_308.
  super__Vector_base<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
  ._M_impl.super__Vector_impl_data._M_start = (Segment *)0x0;
  local_308.
  super__Vector_base<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
  ._M_impl.super__Vector_impl_data._M_finish = (Segment *)0x0;
  local_328.
  super__Vector_base<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_328.
  super__Vector_base<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
  ._M_impl.super__Vector_impl_data._M_start = (Segment *)0x0;
  local_328.
  super__Vector_base<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
  ._M_impl.super__Vector_impl_data._M_finish = (Segment *)0x0;
  local_348.
  super__Vector_base<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_348.
  super__Vector_base<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
  ._M_impl.super__Vector_impl_data._M_start = (Segment *)0x0;
  local_348.
  super__Vector_base<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
  ._M_impl.super__Vector_impl_data._M_finish = (Segment *)0x0;
  this = (segments->
         super__Vector_base<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
         )._M_impl.super__Vector_impl_data._M_start;
  pvVar1 = (segments->
           super__Vector_base<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (this != pvVar1) {
    do {
      structs::Segment::classify_abi_cxx11_((string *)local_238,this);
      iVar7 = std::__cxx11::string::compare((char *)local_238);
      this_01 = &local_2c8;
      if (iVar7 == 0) {
LAB_001078ab:
        std::
        vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
        ::push_back(this_01,this);
      }
      else {
        iVar7 = std::__cxx11::string::compare((char *)local_238);
        this_01 = &local_2e8;
        if (iVar7 == 0) goto LAB_001078ab;
        iVar7 = std::__cxx11::string::compare((char *)local_238);
        this_01 = &local_308;
        if (iVar7 == 0) goto LAB_001078ab;
        iVar7 = std::__cxx11::string::compare((char *)local_238);
        this_01 = &local_328;
        if (iVar7 == 0) goto LAB_001078ab;
        iVar7 = std::__cxx11::string::compare((char *)local_238);
        this_01 = &local_348;
        if (iVar7 == 0) goto LAB_001078ab;
      }
      if ((undefined1 *)local_238._0_8_ != local_238 + 0x10) {
        operator_delete((void *)local_238._0_8_);
      }
      this = this + 1;
    } while (this != pvVar1);
    local_270 = local_2c8.
                super__Vector_base<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    this_02 = local_2c8.
              super__Vector_base<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (local_2c8.
        super__Vector_base<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_2c8.
        super__Vector_base<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        pSVar4 = local_348.
                 super__Vector_base<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pVar29.second = local_258;
        pVar29.first = local_3a8;
        this_00 = local_348.
                  super__Vector_base<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        while( true ) {
          local_258 = pVar29.second;
          local_3a8 = pVar29.first;
          if (this_00 == pSVar4) break;
          pVar29 = structs::Segment::getGlobalCenter(this_02);
          local_298 = pVar29.second;
          local_288 = pVar29.first;
          dStack_290 = in_XMM1_Qb;
          pVar29 = structs::Segment::getGlobalCenter(this_00);
          local_258 = pVar29.second;
          local_3a8 = pVar29.first;
          dStack_250 = in_XMM1_Qb;
          if (local_288 <= local_3a8) {
            dVar16 = structs::Segment::getDistance(this_02,this_00);
            uVar9 = structs::Segment::getWidth(this_02);
            uVar10 = structs::Segment::getWidth(this_00);
            pVar3.second = local_258;
            pVar3.first = local_3a8;
            pVar29.second = local_258;
            pVar29.first = local_3a8;
            lVar11 = uVar10 + uVar9;
            auVar18._8_4_ = (int)((ulong)lVar11 >> 0x20);
            auVar18._0_8_ = lVar11;
            auVar18._12_4_ = 0x45300000;
            in_XMM1_Qb = auVar18._8_8_ - 1.9342813113834067e+25;
            dVar16 = dVar16 / ((in_XMM1_Qb +
                               ((double)CONCAT44(0x43300000,(int)lVar11) - 4503599627370496.0)) *
                               0.5 * 4.0);
            if ((0.8 <= dVar16) && (pVar29 = pVar3, dVar16 <= 1.2)) {
              local_238._16_8_ = 0;
              local_238._24_8_ = 0.0;
              local_238._0_8_ = (pointer)0x0;
              local_238._8_8_ = 0;
              cv::Mat::Mat((Mat *)local_218);
              local_218[0] = local_218[0] & 0xfffff000 | 0x10;
              local_138.yMin = 0;
              local_138.yMax = 0;
              local_138.xMin = 0;
              local_138.xMax = 0;
              cv::Mat::Mat(&local_138.pixels.super_Mat);
              local_138.pixels._0_4_ = local_138.pixels._0_4_ & 0xfffff000 | 0x10;
              local_1b8.yMin = 0;
              local_1b8.yMax = 0;
              local_1b8.xMin = 0;
              local_1b8.xMax = 0;
              cv::Mat::Mat(&local_1b8.pixels.super_Mat);
              pSVar5 = local_2e8.
                       super__Vector_base<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              local_1b8.pixels._0_4_ = local_1b8.pixels._0_4_ & 0xfffff000 | 0x10;
              local_268 = local_298;
              dStack_260 = local_288;
              dVar16 = (local_258 - local_298) * 0.25;
              dVar23 = (local_3a8 - local_288) * 0.25;
              local_378 = -1.5;
              if (dVar16 <= 0.0) {
                local_378 = 1.5;
              }
              local_248 = 1.5;
              if (dVar16 <= 0.0) {
                local_248 = -1.5;
              }
              puVar13 = &DAT_00110800;
              local_2a8 = *(double *)(&DAT_00110800 + (ulong)(0.0 < dVar16) * 8);
              uStack_2a0 = 0;
              dVar25 = local_378 * (dVar16 + local_2a8);
              uStack_240 = 0;
              dVar26 = local_248 * (dVar16 + local_2a8);
              dVar27 = dVar23 * 1.5;
              in_XMM1_Qb = dVar27;
              if (local_2e8.
                  super__Vector_base<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
                  ._M_impl.super__Vector_impl_data._M_start !=
                  local_2e8.
                  super__Vector_base<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
                dVar17 = dVar16 * 0.0 + local_298;
                dVar24 = dVar23 * 0.0 + local_288;
                local_3a8 = dVar25 + dVar17;
                pSVar15 = local_2e8.
                          super__Vector_base<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                do {
                  pVar29 = structs::Segment::getGlobalCenter(pSVar15);
                  in_XMM1_Qb = pVar29.first;
                  auVar19._8_8_ = -(ulong)(in_XMM1_Qb < dVar23 * -1.5 + dVar24);
                  auVar19._0_8_ = -(ulong)(pVar29.second < local_3a8);
                  uVar8 = movmskpd(extraout_EAX,auVar19);
                  if ((uVar8 & 2) == 0) {
                    auVar20._8_8_ = -(ulong)(dVar24 + dVar27 < in_XMM1_Qb);
                    auVar20._0_8_ = -(ulong)(dVar17 + dVar26 < pVar29.second);
                    uVar12 = movmskpd((int)puVar13,auVar20);
                    puVar13 = (undefined *)(ulong)uVar12;
                    if ((((byte)((byte)uVar12 >> 1) == 0) && ((uVar8 & 1) == 0)) &&
                       ((uVar12 & 1) == 0)) {
                      local_238._0_8_ = pSVar15->xMin;
                      local_238._8_8_ = pSVar15->xMax;
                      local_238._16_8_ = pSVar15->yMin;
                      in_XMM1_Qb = (double)pSVar15->yMax;
                      local_238._24_8_ = in_XMM1_Qb;
                      cv::Mat::operator=((Mat *)local_218,&(pSVar15->pixels).super_Mat);
                      break;
                    }
                  }
                  pSVar15 = pSVar15 + 1;
                } while (pSVar15 != pSVar5);
              }
              bVar6 = structs::Segment::isValid((Segment *)local_238);
              pSVar5 = local_308.
                       super__Vector_base<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              if (bVar6) {
                local_3a8 = dVar23 * -1.5;
                in_XMM1_Qb = dVar23;
                if (local_308.
                    super__Vector_base<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
                    ._M_impl.super__Vector_impl_data._M_start !=
                    local_308.
                    super__Vector_base<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
                  dVar28 = local_2a8 + dVar16;
                  dVar24 = local_288 + dVar23;
                  local_3a8 = local_3a8 + dVar24;
                  dVar17 = local_298 + dVar16;
                  in_XMM1_Qb = 0.0;
                  local_2a8 = dVar28 * local_248 + dVar17;
                  pSVar15 = local_308.
                            super__Vector_base<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  do {
                    pVar29 = structs::Segment::getGlobalCenter(pSVar15);
                    if (((local_3a8 <= pVar29.first) && (pVar29.first <= dVar23 * 1.5 + dVar24)) &&
                       ((local_378 * dVar28 + dVar17 <= pVar29.second &&
                        (pVar29.second <= local_2a8)))) {
                      local_138.xMin = pSVar15->xMin;
                      local_138.xMax = pSVar15->xMax;
                      local_138.yMin = pSVar15->yMin;
                      in_XMM1_Qb = (double)pSVar15->yMax;
                      local_138.yMax = (uint64_t)in_XMM1_Qb;
                      cv::Mat::operator=(&local_138.pixels.super_Mat,&(pSVar15->pixels).super_Mat);
                      break;
                    }
                    pSVar15 = pSVar15 + 1;
                  } while (pSVar15 != pSVar5);
                }
                bVar6 = structs::Segment::isValid(&local_138);
                pSVar5 = local_328.
                         super__Vector_base<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
                if (bVar6) {
                  if (local_328.
                      super__Vector_base<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
                      ._M_impl.super__Vector_impl_data._M_start !=
                      local_328.
                      super__Vector_base<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
                      ._M_impl.super__Vector_impl_data._M_finish) {
                    dVar16 = dVar16 + dVar16 + local_268;
                    dVar17 = dVar23 + dVar23 + dStack_260;
                    pSVar15 = local_328.
                              super__Vector_base<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                    do {
                      pVar29 = structs::Segment::getGlobalCenter(pSVar15);
                      in_XMM1_Qb = pVar29.first;
                      auVar21._8_8_ = -(ulong)(in_XMM1_Qb < dVar23 * -1.5 + dVar17);
                      auVar21._0_8_ = -(ulong)(pVar29.second < dVar25 + dVar16);
                      uVar8 = movmskpd(extraout_EAX_00,auVar21);
                      if ((uVar8 & 2) == 0) {
                        auVar22._8_8_ = -(ulong)(dVar27 + dVar17 < in_XMM1_Qb);
                        auVar22._0_8_ = -(ulong)(dVar26 + dVar16 < pVar29.second);
                        uVar12 = movmskpd((int)puVar13,auVar22);
                        puVar13 = (undefined *)(ulong)uVar12;
                        if ((((byte)((byte)uVar12 >> 1) == 0) && ((uVar8 & 1) == 0)) &&
                           ((uVar12 & 1) == 0)) {
                          local_1b8.xMin = pSVar15->xMin;
                          local_1b8.xMax = pSVar15->xMax;
                          local_1b8.yMin = pSVar15->yMin;
                          in_XMM1_Qb = (double)pSVar15->yMax;
                          local_1b8.yMax = (uint64_t)in_XMM1_Qb;
                          cv::Mat::operator=(&local_1b8.pixels.super_Mat,
                                             &(pSVar15->pixels).super_Mat);
                          break;
                        }
                      }
                      pSVar15 = pSVar15 + 1;
                    } while (pSVar15 != pSVar5);
                  }
                  bVar6 = structs::Segment::isValid(&local_1b8);
                  if (bVar6) {
                    local_b8.yMin = 0;
                    local_b8.yMax = 0;
                    local_b8.xMin = 0;
                    local_b8.xMax = 0;
                    cv::Mat::Mat(&local_b8.pixels.super_Mat);
                    local_b8.pixels._0_4_ = local_b8.pixels._0_4_ & 0xfffff000 | 0x10;
                    local_b8.xMin = this_02->xMin;
                    local_b8.xMax = this_00->xMax;
                    pSVar14 = this_02;
                    pSVar2 = this_00;
                    if (local_298 < local_258) {
                      pSVar14 = this_00;
                      pSVar2 = this_02;
                    }
                    local_b8.yMin = pSVar2->yMin;
                    local_b8.yMax = pSVar14->yMax;
                    std::
                    vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
                    ::push_back(__return_storage_ptr__,&local_b8);
                    cv::Mat::~Mat(&local_b8.pixels.super_Mat);
                  }
                }
              }
              cv::Mat::~Mat(&local_1b8.pixels.super_Mat);
              cv::Mat::~Mat(&local_138.pixels.super_Mat);
              cv::Mat::~Mat((Mat *)local_218);
              pVar29.second = local_258;
              pVar29.first = local_3a8;
            }
          }
          this_00 = this_00 + 1;
        }
        this_02 = this_02 + 1;
      } while (this_02 != local_270);
    }
  }
  std::
  vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
  ::~vector(&local_348);
  std::
  vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
  ::~vector(&local_328);
  std::
  vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
  ::~vector(&local_308);
  std::
  vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
  ::~vector(&local_2e8);
  std::
  vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
  ::~vector(&local_2c8);
  return __return_storage_ptr__;
}

Assistant:

std::vector<structs::Segment> 
detection::groupLetters(
    const std::vector<structs::Segment>& segments
)
{
    std::vector<structs::Segment> boundingBoxes;

    std::vector<structs::Segment> lettersT;
    std::vector<structs::Segment> lettersE;
    std::vector<structs::Segment> lettersS;
    std::vector<structs::Segment> lettersC;
    std::vector<structs::Segment> lettersO;

    for (const auto& segment: segments) {
        const auto classification = segment.classify();

        if (classification == "LETTER_T") {
            lettersT.push_back(segment);
            continue;
        }
        if (classification == "LETTER_E") {
            lettersE.push_back(segment);
            continue;
        }
        if (classification == "LETTER_S") {
            lettersS.push_back(segment);
            continue;
        }
        if (classification == "LETTER_C") {
            lettersC.push_back(segment);
            continue;
        }
        if (classification == "LETTER_O") {
            lettersO.push_back(segment);
            continue;
        }
    }

    for (const auto& segmentT: lettersT) {
        for (const auto& segmentO: lettersO) {
            // Do not detect mirrored images
            const auto tGlobalCenter = segmentT.getGlobalCenter();
            const auto oGlobalCenter = segmentO.getGlobalCenter();

            if (tGlobalCenter.first - oGlobalCenter.first > 0) {
                continue;
            }

            const auto distance = structs::Segment::getDistance(segmentT, segmentO);
            const auto avgWidth = ((double) (segmentT.getWidth() + segmentO.getWidth())) / 2;
            const auto expectedDistance = avgWidth * 4;

            const auto ratio = distance / expectedDistance;

            // If distance seems too long or too short, skip it
            if (ratio < 0.8 || ratio > 1.2) {
                continue;
            }

            // Interpolate possible places for next letters
            structs::Segment segmentE;
            structs::Segment segmentS;
            structs::Segment segmentC;

            const auto xDiff = ((double) (oGlobalCenter.first - tGlobalCenter.first)) / 4;
            const auto yDiff = ((double) (oGlobalCenter.second - tGlobalCenter.second)) / 4;

            // - Find letter E
            {
                const auto expectedCenterXMin = tGlobalCenter.first + (xDiff * 0) + (xDiff * -1.5); 
                const auto expectedCenterXMax = tGlobalCenter.first + (xDiff * 0) + (xDiff * 1.5); 
                const auto expectedCenterYMin = tGlobalCenter.second + (yDiff * 0) + ((yDiff > 0 ? yDiff + 1 : yDiff - 1) * (yDiff > 0 ? -1.5 : 1.5)); 
                const auto expectedCenterYMax = tGlobalCenter.second + (yDiff * 0) + ((yDiff > 0 ? yDiff + 1 : yDiff - 1) * (yDiff > 0 ? 1.5 : -1.5)); 

                for (const auto& thisSegment: lettersE) {
                    const auto thisGlobalCenter = thisSegment.getGlobalCenter();

                    if (thisGlobalCenter.first < expectedCenterXMin) {
                        continue;
                    }
                    if (thisGlobalCenter.first > expectedCenterXMax) {
                        continue;
                    }
                    if (thisGlobalCenter.second < expectedCenterYMin) {
                        continue;
                    }
                    if (thisGlobalCenter.second > expectedCenterYMax) {
                        continue;
                    }

                    segmentE = thisSegment;

                    break;
                }

                if (!segmentE.isValid()) {
                    continue;
                }
            }

            // - Find letter S
            {
                const auto expectedCenterXMin = tGlobalCenter.first + (xDiff * 1) + (xDiff * -1.5); 
                const auto expectedCenterXMax = tGlobalCenter.first + (xDiff * 1) + (xDiff * 1.5); 
                const auto expectedCenterYMin = tGlobalCenter.second + (yDiff * 1) + ((yDiff > 0 ? yDiff + 1 : yDiff - 1) * (yDiff > 0 ? -1.5 : 1.5)); 
                const auto expectedCenterYMax = tGlobalCenter.second + (yDiff * 1) + ((yDiff > 0 ? yDiff + 1 : yDiff - 1) * (yDiff > 0 ? 1.5 : -1.5)); 

                for (const auto& thisSegment: lettersS) {
                    const auto thisGlobalCenter = thisSegment.getGlobalCenter();

                    if (thisGlobalCenter.first < expectedCenterXMin) {
                        continue;
                    }
                    if (thisGlobalCenter.first > expectedCenterXMax) {
                        continue;
                    }
                    if (thisGlobalCenter.second < expectedCenterYMin) {
                        continue;
                    }
                    if (thisGlobalCenter.second > expectedCenterYMax) {
                        continue;
                    }

                    segmentS = thisSegment;

                    break;
                }

                if (!segmentS.isValid()) {
                    continue;
                }
            }

            // - Find letter C
            {
                const auto expectedCenterXMin = tGlobalCenter.first + (xDiff * 2) + (xDiff * -1.5); 
                const auto expectedCenterXMax = tGlobalCenter.first + (xDiff * 2) + (xDiff * 1.5); 
                const auto expectedCenterYMin = tGlobalCenter.second + (yDiff * 2) + ((yDiff > 0 ? yDiff + 1 : yDiff - 1) * (yDiff > 0 ? -1.5 : 1.5)); 
                const auto expectedCenterYMax = tGlobalCenter.second + (yDiff * 2) + ((yDiff > 0 ? yDiff + 1 : yDiff - 1) * (yDiff > 0 ? 1.5 : -1.5)); 

                for (const auto& thisSegment: lettersC) {
                    const auto thisGlobalCenter = thisSegment.getGlobalCenter();

                    if (thisGlobalCenter.first < expectedCenterXMin) {
                        continue;
                    }
                    if (thisGlobalCenter.first > expectedCenterXMax) {
                        continue;
                    }
                    if (thisGlobalCenter.second < expectedCenterYMin) {
                        continue;
                    }
                    if (thisGlobalCenter.second > expectedCenterYMax) {
                        continue;
                    }

                    segmentC = thisSegment;

                    break;
                }

                if (!segmentC.isValid()) {
                    continue;
                }
            }

            // Found all letters, store bounding box and skip to next T letter
            structs::Segment bbox;

            bbox.xMin = segmentT.xMin;
            bbox.xMax = segmentO.xMax;

            if (tGlobalCenter.second < oGlobalCenter.second) {
                // Top to bottom
                bbox.yMin = segmentT.yMin;
                bbox.yMax = segmentO.yMax;
            } else {
                // Bottom to top
                bbox.yMin = segmentO.yMin;
                bbox.yMax = segmentT.yMax;
            }

            // Note: possible slight optimisation
            //       remove used letters from containers to prevent re-checking them

            boundingBoxes.push_back(bbox);
        }
    }

    return boundingBoxes;
}